

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

double __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::
ReadConstant(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
             *this,char code)

{
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  double dVar1;
  int iVar2;
  ushort *puVar3;
  undefined7 in_register_00000031;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_10;
  
  local_10.field_1.values_ = (Value *)&local_28;
  this_00 = this->reader_;
  iVar2 = (int)CONCAT71(in_register_00000031,code);
  if (iVar2 == 0x6c) {
    iVar2 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this_00);
  }
  else {
    if (iVar2 != 0x73) {
      if (iVar2 == 0x6e) {
        dVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        return dVar1;
      }
      local_28 = 0;
      uStack_20 = 0;
      local_10.types_ = 0;
      BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)0x25fd81,&local_10)
      ;
    }
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    puVar3 = (ushort *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,2);
    iVar2 = (int)(short)(*puVar3 << 8 | *puVar3 >> 8);
  }
  return (double)iVar2;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}